

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O1

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,_1,false>,_1,_1,false>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>,_1,1,false>const>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,1,_1,1,1,8>,0,Eigen::Stride<0,0>>>>
               (Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>_>
                *lhs,Transpose<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>_>_>
                     *rhs,
               Transpose<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_8>,_0,_Eigen::Stride<0,_0>_>_>
               *dest,Scalar *alpha)

{
  ulong uVar1;
  PointerType pfVar2;
  XprTypeNested pMVar3;
  ResScalar *res;
  undefined8 *puVar4;
  const_blas_data_mapper<float,_long,_1> *pcVar5;
  long cols;
  long rows;
  float *__ptr;
  Scalar alpha_00;
  const_blas_data_mapper<float,_long,_1> local_68;
  const_blas_data_mapper<float,_long,_0> local_58;
  long local_48;
  long local_40;
  Scalar local_34;
  
  pcVar5 = &local_68;
  uVar1 = (rhs->m_matrix).m_matrix.
          super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,_0>
          .m_rows.m_value;
  if (uVar1 >> 0x3e == 0) {
    pfVar2 = (lhs->m_matrix).
             super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_0>
             .m_data;
    cols = (lhs->m_matrix).
           super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_0>
           .m_rows.m_value;
    rows = (lhs->m_matrix).
           super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false>,_0>
           .m_cols.m_value;
    pMVar3 = (lhs->m_matrix).
             super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,__1,_false,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_true>.m_xpr
    ;
    alpha_00 = *alpha;
    local_58.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
         (rhs->m_matrix).m_matrix.
         super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,_0>
         .m_data;
    if (local_58.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data == (float *)0x0) {
      if (uVar1 < 0x8001) {
        local_58.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
             (float *)((long)&local_68 - (uVar1 * 4 + 0x1e & 0xfffffffffffffff0));
        pcVar5 = (const_blas_data_mapper<float,_long,_1> *)
                 local_58.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
        __ptr = local_58.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
      }
      else {
        local_48 = cols;
        local_40 = rows;
        local_34 = alpha_00;
        local_58.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
             (float *)malloc(uVar1 * 4);
        if (((ulong)local_58.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data & 0xf) != 0)
        {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/Memory.h"
                        ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        cols = local_48;
        rows = local_40;
        __ptr = local_58.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data;
        alpha_00 = local_34;
        if (local_58.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data == (float *)0x0)
        goto LAB_00167e2a;
      }
    }
    else {
      pcVar5 = &local_68;
      __ptr = (float *)0x0;
    }
    local_68.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_stride =
         (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>).m_storage.m_rows;
    local_58.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = 1;
    res = (dest->m_matrix).
          super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_8>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_8>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data;
    local_68.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_data = pfVar2;
    if ((res != (ResScalar *)0x0) &&
       ((dest->m_matrix).
        super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_8>,_0,_Eigen::Stride<0,_0>_>,_1>.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_8>,_0,_Eigen::Stride<0,_0>_>,_0>.
        m_cols.m_value < 0)) {
      *(float *)((long)pcVar5 + -8) = 2.065748e-39;
      *(float *)((long)pcVar5 + -4) = 0.0;
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                    ,0xb2,
                    "Eigen::MapBase<Eigen::Block<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float, 1, -1, 1, 1, 8>>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float, 1, -1, 1, 1, 8>>>, -1, 1, true>, Level = 0]"
                   );
    }
    *(float *)((long)pcVar5 + -8) = 2.065595e-39;
    *(float *)((long)pcVar5 + -4) = 0.0;
    general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_1,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
    ::run(rows,cols,&local_68,&local_58,res,1,alpha_00);
    if (0x8000 < uVar1) {
      *(float *)((long)pcVar5 + -8) = 2.065619e-39;
      *(float *)((long)pcVar5 + -4) = 0.0;
      free(__ptr);
    }
    return;
  }
LAB_00167e2a:
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = boost::program_options::detail::cmdline::cmdline;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }